

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O3

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int iVar1;
  int iVar2;
  uint _w;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  int j;
  long lVar8;
  int i;
  ulong uVar9;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar2 = inch + 7;
  if (-1 < inch) {
    iVar2 = inch;
  }
  iVar1 = outch + 3;
  if (-1 < outch) {
    iVar1 = outch;
  }
  Mat::create(kernel_tm,_w * 0x20,iVar2 >> 3,iVar1 >> 2,1,(Allocator *)0x0);
  if (3 < outch) {
    uVar3 = 0;
    do {
      if (7 < inch) {
        pvVar6 = (void *)((uVar3 >> 2) * kernel_tm->cstep * kernel_tm->elemsize +
                         (long)kernel_tm->data);
        lVar4 = 0;
        do {
          if (0 < (int)_w) {
            uVar5 = 0;
            do {
              uVar9 = 0;
              do {
                pvVar7 = pvVar6;
                lVar8 = 0;
                do {
                  *(undefined1 *)((long)pvVar7 + lVar8) =
                       *(undefined1 *)
                        ((long)local_78.data +
                        uVar5 + (lVar4 + lVar8) * (long)local_78.w * local_78.elemsize +
                                local_78.cstep * (uVar9 | uVar3) * local_78.elemsize);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 8);
                uVar9 = uVar9 + 1;
                pvVar6 = (void *)((long)pvVar7 + 8);
              } while (uVar9 != 4);
              uVar5 = uVar5 + 1;
              pvVar6 = (void *)((long)pvVar7 + 8);
            } while (uVar5 != _w);
            pvVar6 = (void *)((long)pvVar7 + 8);
          }
          lVar8 = lVar4 + 0xf;
          lVar4 = lVar4 + 8;
        } while (lVar8 < inch);
      }
      uVar5 = uVar3 + 7;
      uVar3 = uVar3 + 4;
    } while (uVar5 < (uint)outch);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8a-4b-maxk-inch/8a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(32 * maxk, inch / 8, outch / 4, (size_t)1u);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
}